

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::Type::Deserialize(Type *this,Parser *parser,Type *type)

{
  int *piVar1;
  StructDef *pSVar2;
  uint16_t uVar3;
  BaseType BVar4;
  BaseType BVar5;
  char *pcVar6;
  int __c;
  int extraout_EDX;
  int iVar7;
  int __c_00;
  int extraout_EDX_00;
  int __c_01;
  Parser *__s;
  bool bVar8;
  
  if (type == (Type *)0x0) {
    return true;
  }
  __s = parser;
  BVar4 = reflection::Type::base_type(type);
  this->base_type = BVar4;
  BVar4 = reflection::Type::element(type);
  this->element = BVar4;
  uVar3 = reflection::Type::fixed_length(type);
  this->fixed_length = uVar3;
  pcVar6 = reflection::Type::index(type,(char *)__s,__c);
  if (-1 < (int)pcVar6) {
    BVar5 = reflection::Type::base_type(type);
    bVar8 = true;
    if (BVar5 != Vector) {
      BVar5 = reflection::Type::base_type(type);
      bVar8 = BVar5 == Array;
    }
    BVar5 = reflection::Type::base_type(type);
    iVar7 = extraout_EDX;
    if ((BVar5 == Obj) ||
       ((bVar8 && (BVar5 = reflection::Type::element(type), iVar7 = extraout_EDX_00, BVar5 == Obj)))
       ) {
      pcVar6 = reflection::Type::index(type,(char *)__s,iVar7);
      if ((ulong)((long)(parser->structs_).vec.
                        super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(parser->structs_).vec.
                        super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)(long)(int)pcVar6)
      {
        return false;
      }
      pcVar6 = reflection::Type::index(type,(char *)__s,__c_00);
      pSVar2 = (parser->structs_).vec.
               super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)pcVar6];
      this->struct_def = pSVar2;
      piVar1 = &(pSVar2->super_Definition).refcount;
      *piVar1 = *piVar1 + 1;
    }
    else {
      pcVar6 = reflection::Type::index(type,(char *)__s,iVar7);
      if ((ulong)((long)(parser->enums_).vec.
                        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(parser->enums_).vec.
                        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)(long)(int)pcVar6)
      {
        return false;
      }
      pcVar6 = reflection::Type::index(type,(char *)__s,__c_01);
      this->enum_def =
           (parser->enums_).vec.
           super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
           _M_impl.super__Vector_impl_data._M_start[(int)pcVar6];
    }
    return true;
  }
  return true;
}

Assistant:

bool Type::Deserialize(const Parser &parser, const reflection::Type *type) {
  if (type == nullptr) return true;
  base_type = static_cast<BaseType>(type->base_type());
  element = static_cast<BaseType>(type->element());
  fixed_length = type->fixed_length();
  if (type->index() >= 0) {
    bool is_series = type->base_type() == reflection::Vector ||
                     type->base_type() == reflection::Array;
    if (type->base_type() == reflection::Obj ||
        (is_series && type->element() == reflection::Obj)) {
      if (static_cast<size_t>(type->index()) < parser.structs_.vec.size()) {
        struct_def = parser.structs_.vec[type->index()];
        struct_def->refcount++;
      } else {
        return false;
      }
    } else {
      if (static_cast<size_t>(type->index()) < parser.enums_.vec.size()) {
        enum_def = parser.enums_.vec[type->index()];
      } else {
        return false;
      }
    }
  }
  return true;
}